

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O1

void gain_condition(CHAR_DATA *ch,int iCond,int value)

{
  short *psVar1;
  PC_DATA *pPVar2;
  bool bVar3;
  int iVar4;
  short sVar5;
  char *txt;
  int iVar6;
  
  if (value == 0) {
    return;
  }
  bVar3 = is_npc(ch);
  if (bVar3) {
    return;
  }
  bVar3 = is_immortal(ch);
  if (bVar3) {
    return;
  }
  bVar3 = is_heroimm(ch);
  if (bVar3) {
    return;
  }
  if ((ch->act[0] & 0x8000) != 0) {
    return;
  }
  if (ch->desc == (DESCRIPTOR_DATA *)0x0) {
    return;
  }
  pPVar2 = ch->pcdata;
  sVar5 = pPVar2->condition[iCond];
  if (sVar5 == -1) {
    return;
  }
  iVar6 = value + sVar5;
  iVar4 = 0;
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  pPVar2->condition[iCond] = (short)iVar4;
  if (ch->level < 0xb) {
    if ((iCond == 0) && (sVar5 != 0)) {
      pPVar2->condition[0] = pPVar2->condition[0] + -1;
    }
    else {
      pPVar2->condition[2] = 0;
      pPVar2->condition[3] = 0;
    }
  }
  else {
    iVar4 = number_percent();
    pPVar2 = ch->pcdata;
    if (iVar4 < 0x33) {
      if (((iCond == 2) && (pPVar2->condition[iCond] == 0)) &&
         (bVar3 = is_affected(ch,(int)gsn_accumulate_heat), bVar3)) goto LAB_002c5d14;
    }
    else {
      if ((iCond == 3) && (pPVar2->condition[iCond] == 0)) {
        pPVar2->condition[3] = pPVar2->condition[3] + 1;
      }
      if (((iCond == 2) && (pPVar2->condition[iCond] == 0)) &&
         (bVar3 = is_affected(ch,(int)gsn_cooling_mist), !bVar3)) {
LAB_002c5d14:
        psVar1 = ch->pcdata->condition + 2;
        *psVar1 = *psVar1 + 1;
      }
    }
  }
  pPVar2 = ch->pcdata;
  sVar5 = (short)*(undefined4 *)(pPVar2->condition + 2);
  if (0x4a < sVar5) {
    sVar5 = 0x4b;
  }
  pPVar2->condition[2] = sVar5;
  sVar5 = 0x4b;
  if (pPVar2->condition[3] < 0x4b) {
    sVar5 = pPVar2->condition[3];
  }
  pPVar2->condition[3] = sVar5;
  bVar3 = is_affected(ch,(int)gsn_aura_of_sustenance);
  if (bVar3) {
    pPVar2 = ch->pcdata;
    pPVar2->condition[2] = 0;
    pPVar2->condition[3] = 0;
  }
  if (iCond == 0) {
    if (ch->pcdata->condition[0] != 10) goto LAB_002c5de0;
    txt = "You are sober.\n\r";
  }
  else if (iCond == 2) {
    if (ch->pcdata->condition[2] < 0x33) goto LAB_002c5de0;
    txt = "You are thirsty.\n\r";
  }
  else {
    if ((iCond != 3) || (ch->pcdata->condition[3] < 0x33)) goto LAB_002c5de0;
    txt = "You are hungry.\n\r";
  }
  send_to_char(txt,ch);
LAB_002c5de0:
  iVar4 = (int)ch->pcdata->condition[3];
  if ((iCond == 3 && 0x37 < iVar4) && (send_to_char("You are starving!\n\r",ch), 10 < ch->level)) {
    iVar6 = number_range(iVar4 + -0x32,iVar4 * 2 + -100);
    iVar4 = 0x14;
    if (iVar6 < 0x14) {
      iVar4 = iVar6;
    }
    damage_new(ch,ch,iVar4,-1,0x10,true,false,0,1,"hunger");
  }
  iVar4 = (int)ch->pcdata->condition[2];
  if ((iCond == 2 && 0x37 < iVar4) &&
     (send_to_char("You are dying of thirst!\n\r",ch), 10 < ch->level)) {
    iVar4 = number_range(iVar4 + -0x32,iVar4 * 2 + -100);
    if (0x13 < iVar4) {
      iVar4 = 0x14;
    }
    damage_new(ch,ch,iVar4,-1,0x14,true,false,0,1,"thirst");
  }
  return;
}

Assistant:

void gain_condition(CHAR_DATA *ch, int iCond, int value)
{
	int condition;
	int counter;

	if (value == 0 || is_npc(ch) || is_immortal(ch) || is_heroimm(ch) || IS_SET(ch->act, PLR_NOVOID))
		return;

	if (!ch->desc)
		return;

	condition = ch->pcdata->condition[iCond];

	if (condition == -1)
		return;

	ch->pcdata->condition[iCond] = std::max(0, condition + value);

	if (ch->level > 10)
	{
		if (number_percent() > 50)
		{
			if (ch->pcdata->condition[iCond] == 0 && iCond == COND_HUNGER)
				ch->pcdata->condition[COND_HUNGER]++;

			if (ch->pcdata->condition[iCond] == 0 && iCond == COND_THIRST && !is_affected(ch, gsn_cooling_mist))
				ch->pcdata->condition[COND_THIRST]++;
		}
		else if (ch->pcdata->condition[iCond] == 0 && iCond == COND_THIRST && is_affected(ch, gsn_accumulate_heat))
		{
			ch->pcdata->condition[COND_THIRST]++;
		}
	}
	else if (iCond == COND_DRUNK && condition)
	{
		ch->pcdata->condition[COND_DRUNK]--;
	}
	else
	{
		ch->pcdata->condition[COND_THIRST] = 0;
		ch->pcdata->condition[COND_HUNGER] = 0;
	}

	ch->pcdata->condition[COND_THIRST] = std::min((int)ch->pcdata->condition[COND_THIRST], 75);
	ch->pcdata->condition[COND_HUNGER] = std::min((int)ch->pcdata->condition[COND_HUNGER], 75);

	if (is_affected(ch, gsn_aura_of_sustenance))
	{
		ch->pcdata->condition[COND_HUNGER] = 0;
		ch->pcdata->condition[COND_THIRST] = 0;
	}

	switch (iCond)
	{
		case COND_HUNGER:
			if (ch->pcdata->condition[COND_HUNGER] > COND_HUNGRY)
				send_to_char("You are hungry.\n\r", ch);

			break;
		case COND_THIRST:
			if (ch->pcdata->condition[COND_THIRST] > COND_HUNGRY)
				send_to_char("You are thirsty.\n\r", ch);

			break;
		case COND_DRUNK:
			if (ch->pcdata->condition[COND_DRUNK] == 10)
				send_to_char("You are sober.\n\r", ch);

			break;
		default:
			break;
	}

	if (ch->pcdata->condition[COND_HUNGER] > COND_HUNGRY + 5 && iCond == COND_HUNGER)
	{
		counter = ch->pcdata->condition[COND_HUNGER] - COND_HUNGRY;
		send_to_char("You are starving!\n\r", ch);

		if (ch->level > 10)
			damage_new(ch, ch, std::min(20, number_range(counter, 2 * counter)), TYPE_UNDEFINED, DAM_OTHER, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "hunger");
	}

	if (ch->pcdata->condition[COND_THIRST] > COND_HUNGRY + 5 && iCond == COND_THIRST)
	{
		counter = ch->pcdata->condition[COND_THIRST] - COND_HUNGRY;
		send_to_char("You are dying of thirst!\n\r", ch);

		if (ch->level > 10)
			damage_new(ch, ch, std::min(20, number_range(counter, 2 * counter)), TYPE_UNDEFINED, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "thirst");
	}
}